

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t archive_acl_from_text_nl
                  (archive_acl *acl,char *text,size_t length,wchar_t want_type,
                  archive_string_conv *sc)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  char *p;
  ulong uVar9;
  char *pcVar10;
  archive_acl_entry *paVar11;
  anon_struct_16_2_267fbce2 *paVar12;
  uint uVar13;
  byte *pbVar14;
  char *pcVar15;
  wchar_t wVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  int *piVar20;
  byte bVar21;
  wchar_t tag;
  byte *pbVar22;
  ulong uVar23;
  byte *pbVar24;
  ulong uVar25;
  long lVar26;
  wchar_t local_e0;
  wchar_t local_dc;
  wchar_t id;
  wchar_t local_d4;
  char *local_d0;
  wchar_t local_c4;
  char *local_c0;
  ulong local_b8;
  wchar_t local_ac;
  archive_acl *local_a8;
  archive_string_conv *local_a0;
  anon_struct_16_2_267fbce2 field [6];
  
  uVar23 = 5;
  local_c4 = want_type;
  if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
    if (want_type == L'㰀') {
      uVar23 = 6;
    }
    else {
      if (want_type != L'̀') {
        return L'\xffffffe2';
      }
      local_c4 = L'Ā';
    }
  }
  local_ac = L'\0';
  local_a8 = acl;
  local_a0 = sc;
  wVar8 = L'\0';
switchD_0015f3ad_caseD_7:
  do {
    do {
      do {
        local_dc = wVar8;
        if ((((byte *)text == (byte *)0x0) || (length == 0)) || (*text == 0)) {
          archive_acl_reset(local_a8,local_ac);
          return local_dc;
        }
        paVar12 = field;
        uVar25 = 1;
        uVar3 = 0;
        do {
          uVar17 = uVar3;
          uVar9 = uVar25;
          paVar12 = paVar12 + 1;
          pbVar18 = (byte *)text + length;
          lVar26 = -length;
          while (((pbVar14 = pbVar18, lVar26 != 0 &&
                  (pbVar14 = (byte *)text, (ulong)(byte)*text < 0x21)) &&
                 ((0x100000600U >> ((ulong)(byte)*text & 0x3f) & 1) != 0))) {
            text = (char *)((byte *)text + 1);
            lVar26 = lVar26 + 1;
          }
          lVar2 = -lVar26;
          pbVar18 = pbVar14;
          while ((pbVar19 = pbVar14 + lVar2, lVar26 != 0 &&
                 ((0x3a < (ulong)*pbVar18 ||
                  (pbVar19 = pbVar18, (0x400100900000600U >> ((ulong)*pbVar18 & 0x3f) & 1) == 0)))))
          {
            pbVar18 = pbVar18 + 1;
            lVar26 = lVar26 + 1;
          }
          pbVar22 = pbVar19 + -lVar26;
          pbVar18 = pbVar19;
          for (; bVar21 = *pbVar18, lVar26 != 0; lVar26 = lVar26 + 1) {
            if (bVar21 == 10) {
LAB_0015f2c0:
              lVar26 = -lVar26;
              pbVar22 = pbVar18;
              goto LAB_0015f304;
            }
            if (bVar21 == 0x23) goto LAB_0015f2ce;
            if ((bVar21 == 0x2c) || (bVar21 == 0x3a)) goto LAB_0015f2c0;
            pbVar18 = pbVar18 + 1;
          }
          pbVar18 = pbVar22;
          if (bVar21 == 0x23) {
LAB_0015f2ce:
            pbVar24 = pbVar18 + -lVar26;
            lVar26 = -lVar26;
            while( true ) {
              bVar21 = *pbVar18;
              if (lVar26 == 0) break;
              pbVar22 = pbVar18;
              if ((bVar21 == 10) || (bVar21 == 0x2c)) goto LAB_0015f304;
              pbVar18 = pbVar18 + 1;
              lVar26 = lVar26 + -1;
            }
            lVar26 = 0;
            pbVar22 = pbVar24;
          }
          else {
            lVar26 = 0;
          }
LAB_0015f304:
          length = 0;
          if (lVar26 != 0) {
            length = lVar26 - 1;
          }
          text = (char *)(pbVar22 + (lVar26 != 0));
          if (uVar17 < uVar23) {
            field[uVar17].start = (char *)pbVar14;
            field[uVar17].end = (char *)pbVar19;
          }
          pcVar15 = field[0].start;
          uVar25 = uVar9 + 1;
          uVar3 = uVar17 + 1;
        } while (bVar21 == 0x3a);
        for (; uVar9 < uVar23; uVar9 = uVar9 + 1) {
          paVar12->start = (char *)0x0;
          paVar12->end = (char *)0x0;
          paVar12 = paVar12 + 1;
        }
      } while ((field[0].start != (char *)0x0) && (wVar8 = local_dc, *field[0].start == '#'));
      id = L'\xffffffff';
      local_d4 = L'\0';
      uVar25 = (long)field[0].end - (long)field[0].start;
      if (local_c4 == L'㰀') goto code_r0x0015f39c;
      iVar4 = 0;
      if (*field[0].start == 'd') {
        local_e0 = L'Ȁ';
        if (uVar25 == 1) {
LAB_0015f3df:
          iVar4 = 1;
        }
        else {
          if (uVar25 < 7) goto LAB_0015f417;
          local_d0 = field[0].start;
          iVar4 = bcmp(field[0].start + 1,"efault",6);
          if (iVar4 == 0) {
            iVar4 = 0;
            if (uVar25 == 7) goto LAB_0015f3df;
            field[0].start = local_d0 + 7;
          }
          else {
            local_e0 = local_c4;
            iVar4 = 0;
          }
        }
      }
      else {
LAB_0015f417:
        local_e0 = local_c4;
      }
      uVar25 = (ulong)((iVar4 + 1U) * 0x10);
      local_d0 = *(char **)((long)&field[0].start + uVar25);
      local_c0 = *(char **)((long)&field[0].end + uVar25);
      isint(local_d0,local_c0,&id);
      uVar6 = (uint)uVar17;
      if ((id == L'\xffffffff') && (iVar4 + 3U <= uVar6)) {
        uVar25 = (ulong)((iVar4 + 3U) * 0x10);
        isint(*(char **)((long)&field[0].start + uVar25),*(char **)((long)&field[0].end + uVar25),
              &id);
      }
      pcVar15 = *(char **)((long)&field[0].start + (ulong)(uint)(iVar4 << 4));
      pcVar10 = *(char **)((long)&field[0].end + (ulong)(uint)(iVar4 << 4));
      lVar26 = (long)pcVar10 - (long)pcVar15;
      wVar8 = L'\xffffffec';
    } while (pcVar10 == pcVar15);
    uVar13 = (int)*pcVar15 - 0x67U >> 1 | (uint)(((int)*pcVar15 - 0x67U & 1) != 0) << 0x1f;
    wVar8 = L'\xffffffec';
  } while (7 < uVar13);
  piVar20 = (int *)(pcVar15 + 1);
  wVar8 = L'\xffffffec';
  switch(uVar13) {
  case 0:
    wVar16 = L'✔';
    tag = L'✓';
    if ((lVar26 != 1) &&
       ((wVar8 = L'\xffffffec', lVar26 != 5 || (wVar8 = L'\xffffffec', *piVar20 != 0x70756f72))))
    goto switchD_0015f3ad_caseD_7;
    break;
  default:
    goto switchD_0015f3ad_caseD_7;
  case 3:
    tag = L'✕';
    if (lVar26 == 1) goto LAB_0015f6a1;
    wVar8 = L'\xffffffec';
    if (lVar26 != 4) goto switchD_0015f3ad_caseD_7;
    iVar5 = bcmp(piVar20,"ask",3);
    tag = L'✕';
    wVar8 = L'\xffffffec';
    if (iVar5 != 0) goto switchD_0015f3ad_caseD_7;
    goto LAB_0015f6a1;
  case 4:
    tag = L'✖';
    if ((lVar26 != 1) &&
       ((wVar8 = L'\xffffffec', lVar26 != 5 || (wVar8 = L'\xffffffec', *piVar20 != 0x72656874))))
    goto switchD_0015f3ad_caseD_7;
LAB_0015f6a1:
    if ((local_d0 < local_c0 && iVar4 + 1U == uVar6) &&
       (wVar8 = ismode(local_d0,local_c0,&local_d4), wVar8 != L'\0')) {
      pcVar15 = (char *)0x0;
      local_d0 = (char *)0x0;
      iVar5 = -1;
      goto LAB_0015f716;
    }
    wVar8 = L'\xffffffec';
    if (iVar4 + 2U == uVar6 && local_d0 < local_c0) goto switchD_0015f3ad_caseD_7;
    pcVar15 = (char *)0x0;
    local_d0 = (char *)0x0;
    iVar5 = 0;
    goto LAB_0015f716;
  case 7:
    wVar16 = L'✒';
    tag = L'✑';
    if (lVar26 != 1) {
      wVar8 = L'\xffffffec';
      if (lVar26 != 4) goto switchD_0015f3ad_caseD_7;
      iVar5 = bcmp(piVar20,"ser",3);
      tag = L'✑';
      wVar8 = L'\xffffffec';
      if (iVar5 != 0) goto switchD_0015f3ad_caseD_7;
    }
  }
  iVar5 = 0;
  pcVar15 = local_c0;
  if ((local_c0 <= local_d0) && (id == L'\xffffffff')) {
    pcVar15 = (char *)0x0;
    local_d0 = (char *)0x0;
    tag = wVar16;
  }
LAB_0015f716:
  wVar16 = local_d4;
  if (local_d4 == L'\0') {
    uVar6 = iVar5 + iVar4 + 2;
    wVar7 = ismode(field[uVar6].start,field[uVar6].end,&local_d4);
    wVar16 = local_d4;
    wVar8 = L'\xffffffec';
    if (wVar7 != L'\0') goto LAB_0015f9e9;
    goto switchD_0015f3ad_caseD_7;
  }
LAB_0015f9e9:
  local_c0 = pcVar15;
  local_b8 = CONCAT44(local_b8._4_4_,id);
  wVar8 = acl_special(local_a8,local_e0,wVar16,tag);
  if (wVar8 != L'\0') {
    paVar11 = acl_new_entry(local_a8,local_e0,wVar16,tag,(wchar_t)local_b8);
    if (paVar11 == (archive_acl_entry *)0x0) {
      return L'\xffffffe7';
    }
    if (((local_d0 == (char *)0x0) || (local_c0 == local_d0)) || (*local_d0 == '\0')) {
      archive_mstring_clean(&paVar11->name);
    }
    else {
      wVar8 = archive_mstring_copy_mbs_len_l
                        (&paVar11->name,local_d0,(long)local_c0 - (long)local_d0,local_a0);
      if (wVar8 != L'\0') {
        piVar20 = __errno_location();
        local_dc = L'\xffffffec';
        if (*piVar20 == 0xc) {
          return L'\xffffffe2';
        }
      }
    }
  }
  local_ac = local_ac | local_e0;
  wVar8 = local_dc;
  goto switchD_0015f3ad_caseD_7;
code_r0x0015f39c:
  wVar8 = L'\xffffffec';
  switch(uVar25) {
  case 4:
    wVar8 = L'\xffffffec';
    if (*(int *)field[0].start != 0x72657375) goto switchD_0015f3ad_caseD_7;
    tag = L'✑';
    goto LAB_0015f592;
  case 5:
    iVar4 = bcmp(field[0].start,"group",5);
    wVar8 = L'\xffffffec';
    if (iVar4 != 0) goto switchD_0015f3ad_caseD_7;
    tag = L'✓';
LAB_0015f592:
    pcVar15 = field[1].end;
    local_d0 = field[1].start;
    isint(field[1].start,field[1].end,&id);
    iVar4 = 1;
    break;
  case 6:
    iVar4 = bcmp(field[0].start,"owner@",6);
    if (iVar4 != 0) {
      iVar4 = bcmp(pcVar15,"group@",6);
      wVar8 = L'\xffffffec';
      if (iVar4 != 0) goto switchD_0015f3ad_caseD_7;
      tag = L'✔';
      goto LAB_0015f55f;
    }
    pcVar15 = (char *)0x0;
    tag = L'✒';
    local_d0 = (char *)0x0;
    iVar4 = 0;
    break;
  default:
    goto switchD_0015f3ad_caseD_7;
  case 9:
    iVar4 = bcmp(field[0].start,"everyone@",9);
    wVar8 = L'\xffffffec';
    if (iVar4 != 0) goto switchD_0015f3ad_caseD_7;
    tag = L'❻';
LAB_0015f55f:
    pcVar15 = (char *)0x0;
    local_d0 = (char *)0x0;
    iVar4 = 0;
  }
  uVar25 = (ulong)(uint)(iVar4 << 4);
  pcVar10 = *(char **)((long)&field[1].start + uVar25);
  wVar16 = L'\0';
LAB_0015f768:
  if (*(char **)((long)&field[1].end + uVar25) <= pcVar10) goto LAB_0015f810;
  cVar1 = *pcVar10;
  pcVar10 = pcVar10 + 1;
  uVar6 = 8;
  switch(cVar1) {
  case 'o':
    uVar6 = 0x4000;
    break;
  case 'p':
    uVar6 = 0x20;
    break;
  case 'q':
  case 't':
  case 'u':
  case 'v':
    goto switchD_0015f7c0_caseD_71;
  case 'r':
    break;
  case 's':
    uVar6 = 0x8000;
    break;
  case 'w':
    uVar6 = 0x10;
    break;
  case 'x':
    uVar6 = 1;
    break;
  default:
    goto switchD_0015f7c0_default;
  }
switchD_0015f7c0_caseD_72:
  wVar16 = wVar16 | uVar6;
  goto LAB_0015f768;
LAB_0015f810:
  pcVar10 = *(char **)((long)&field[2].start + uVar25);
  while (local_c0 = pcVar15, pcVar10 < *(char **)((long)&field[2].end + uVar25)) {
    cVar1 = *pcVar10;
    pcVar10 = pcVar10 + 1;
    if (cVar1 != '-') {
      if (cVar1 == 'F') {
        uVar6 = 0x40000000;
      }
      else if (cVar1 == 'I') {
        uVar6 = 0x1000000;
      }
      else if (cVar1 == 'S') {
        uVar6 = 0x20000000;
      }
      else if (cVar1 == 'n') {
        uVar6 = 0x8000000;
      }
      else if (cVar1 == 'f') {
        uVar6 = 0x2000000;
      }
      else if (cVar1 == 'i') {
        uVar6 = 0x10000000;
      }
      else {
        if (cVar1 != 'd') goto switchD_0015f7c0_caseD_71;
        uVar6 = 0x4000000;
      }
      wVar16 = wVar16 | uVar6;
    }
  }
  piVar20 = *(int **)((long)&field[3].start + uVar25);
  lVar26 = *(long *)((long)&field[3].end + uVar25) - (long)piVar20;
  local_d4 = wVar16;
  if (lVar26 == 5) {
    local_b8 = uVar25;
    iVar4 = bcmp(piVar20,"allow",5);
    if (iVar4 == 0) {
      local_e0 = L'Ѐ';
      uVar25 = local_b8;
    }
    else {
      iVar4 = bcmp(piVar20,"audit",5);
      if (iVar4 == 0) {
        local_e0 = L'က';
        uVar25 = local_b8;
      }
      else {
        iVar4 = bcmp(piVar20,"alarm",5);
        wVar8 = L'\xffffffec';
        if (iVar4 != 0) goto switchD_0015f3ad_caseD_7;
        local_e0 = L'\x2000';
        uVar25 = local_b8;
      }
    }
  }
  else {
    wVar8 = L'\xffffffec';
    if ((lVar26 != 4) || (wVar8 = L'\xffffffec', *piVar20 != 0x796e6564))
    goto switchD_0015f3ad_caseD_7;
    local_e0 = L'ࠀ';
  }
  isint(*(char **)((long)&field[4].start + uVar25),*(char **)((long)&field[4].end + uVar25),&id);
  pcVar15 = local_c0;
  goto LAB_0015f9e9;
switchD_0015f7c0_default:
  if (cVar1 == '-') goto LAB_0015f768;
  if (cVar1 == 'A') {
    uVar6 = 0x400;
  }
  else if (cVar1 == 'C') {
    uVar6 = 0x2000;
  }
  else if (cVar1 == 'D') {
    uVar6 = 0x100;
  }
  else if (cVar1 == 'R') {
    uVar6 = 0x40;
  }
  else if (cVar1 == 'W') {
    uVar6 = 0x80;
  }
  else if (cVar1 == 'a') {
    uVar6 = 0x200;
  }
  else if (cVar1 == 'c') {
    uVar6 = 0x1000;
  }
  else {
    if (cVar1 != 'd') goto switchD_0015f7c0_caseD_71;
    uVar6 = 0x800;
  }
  goto switchD_0015f7c0_caseD_72;
switchD_0015f7c0_caseD_71:
  local_d4 = wVar16;
  wVar8 = L'\xffffffec';
  goto switchD_0015f3ad_caseD_7;
}

Assistant:

int
archive_acl_from_text_nl(struct archive_acl *acl, const char *text,
    size_t length, int want_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[6], name;

	const char *s, *st;
	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	char sep;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	ret = ARCHIVE_OK;
	types = 0;

	while (text != NULL && length > 0 && *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &length, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == '#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == 'd' && (len == 1 || (len >= 7
			    && memcmp((s + 1), "efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > (n + 3))
				isint(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			if (len == 0) {
				ret = ARCHIVE_WARN;
				continue;
			}

			switch (*s) {
			case 'u':
				if (len == 1 || (len == 4
				    && memcmp(st, "ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case 'g':
				if (len == 1 || (len == 5
				    && memcmp(st, "roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 'o':
				if (len == 1 || (len == 5
				    && memcmp(st, "ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case 'm':
				if (len == 1 || (len == 4
				    && memcmp(st, "ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 3
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (memcmp(s, "user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (memcmp(s, "group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (memcmp(s, "owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (memcmp(s, "group@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (memcmp(s, "everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
				break;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (memcmp(s, "deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (memcmp(s, "allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (memcmp(s, "audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (memcmp(s, "alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint(field[4 + n].start, field[4 + n].end,
			    &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}